

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Image * __thiscall
teetime::Image::resize(Image *__return_storage_ptr__,Image *this,size_t width,size_t height)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  Rgba *pRVar6;
  pointer pRVar7;
  unique_ptr<teetime::Image::Rgba[],_std::default_delete<teetime::Image::Rgba[]>_> local_30;
  unique_ptr<teetime::Image::Rgba[],_std::default_delete<teetime::Image::Rgba[]>_> p;
  size_t height_local;
  size_t width_local;
  Image *this_local;
  Image *image;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = width * height;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  p._M_t.super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>.
  _M_t.super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>.
  super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl =
       (__uniq_ptr_data<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>,_true,_true>
        )(__uniq_ptr_data<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>,_true,_true>
          )height;
  pRVar6 = (Rgba *)operator_new__(uVar5);
  std::unique_ptr<teetime::Image::Rgba[],std::default_delete<teetime::Image::Rgba[]>>::
  unique_ptr<teetime::Image::Rgba*,std::default_delete<teetime::Image::Rgba[]>,void,bool>
            ((unique_ptr<teetime::Image::Rgba[],std::default_delete<teetime::Image::Rgba[]>> *)
             &local_30,pRVar6);
  Image(__return_storage_ptr__);
  pRVar6 = this->m_data;
  sVar2 = this->m_width;
  sVar3 = this->m_height;
  pRVar7 = std::unique_ptr<teetime::Image::Rgba[],_std::default_delete<teetime::Image::Rgba[]>_>::
           get(&local_30);
  height_local._0_4_ = (int)width;
  iVar4 = stbir_resize_uint8(&pRVar6->r,(int)sVar2,(int)sVar3,0,&pRVar7->r,(int)height_local,
                             (int)p._M_t.
                                  super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>
                                  .super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl
                             ,0,4);
  if (iVar4 != 0) {
    pRVar7 = std::unique_ptr<teetime::Image::Rgba[],_std::default_delete<teetime::Image::Rgba[]>_>::
             release(&local_30);
    __return_storage_ptr__->m_data = pRVar7;
    __return_storage_ptr__->m_width = width;
    __return_storage_ptr__->m_height =
         (size_t)p._M_t.
                 super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>
                 .super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl;
  }
  std::unique_ptr<teetime::Image::Rgba[],_std::default_delete<teetime::Image::Rgba[]>_>::~unique_ptr
            (&local_30);
  return __return_storage_ptr__;
}

Assistant:

Image Image::resize(size_t width, size_t height) const
{
  unique_ptr<Rgba[]> p(new Rgba[width * height]);

  Image image;

  if (stbir_resize_uint8((const uint8*)m_data, (int)m_width, (int)m_height, 0, (uint8*)p.get(), (int)width, (int)height, 0, 4) != 0)
  {
    image.m_data = p.release();
    image.m_width = width;
    image.m_height = height;
  }

  return image;
}